

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_multi.cc
# Opt level: O0

bool children(log_multi *b,uint32_t *current,uint32_t *class_index,uint32_t label)

{
  int iVar1;
  long lVar2;
  uint uVar3;
  uint32_t uVar4;
  size_t sVar5;
  node *pnVar6;
  node_pred *pnVar7;
  ostream *poVar8;
  void *this;
  uint32_t in_ECX;
  uint *in_RDX;
  uint *in_RSI;
  long in_RDI;
  uint32_t nonswap_child;
  uint32_t swap_grandparent;
  uint32_t swap_parent;
  uint32_t swap_child;
  uint32_t right_child;
  uint32_t left_child;
  undefined4 in_stack_fffffffffffffe68;
  undefined4 in_stack_fffffffffffffe6c;
  undefined4 in_stack_fffffffffffffe70;
  undefined4 in_stack_fffffffffffffe74;
  uint32_t in_stack_fffffffffffffe7c;
  undefined4 in_stack_fffffffffffffe80;
  uint32_t uVar9;
  undefined4 in_stack_fffffffffffffe84;
  undefined4 in_stack_fffffffffffffe88;
  undefined4 in_stack_fffffffffffffe8c;
  undefined4 in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe94;
  uint local_108;
  uint local_48;
  uint local_44;
  node_pred local_40;
  uint32_t local_24;
  uint *local_20;
  uint *local_18;
  long local_10;
  
  local_24 = in_ECX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  v_array<node>::operator[]((v_array<node> *)(in_RDI + 8),(ulong)*in_RSI);
  node_pred::node_pred(&local_40,local_24);
  sVar5 = v_array<node_pred>::unique_add_sorted
                    ((v_array<node_pred> *)
                     CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     (node_pred *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
  *local_20 = (uint)sVar5;
  pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
  pnVar7 = v_array<node_pred>::operator[](&pnVar6->preds,(ulong)*local_20);
  pnVar7->label_count = pnVar7->label_count + 1;
  pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
  pnVar7 = v_array<node_pred>::operator[](&pnVar6->preds,(ulong)*local_20);
  uVar3 = pnVar7->label_count;
  pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
  if (pnVar6->max_count < uVar3) {
    pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
    pnVar7 = v_array<node_pred>::operator[](&pnVar6->preds,(ulong)*local_20);
    uVar9 = pnVar7->label_count;
    pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
    pnVar6->max_count = uVar9;
    pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
    pnVar7 = v_array<node_pred>::operator[](&pnVar6->preds,(ulong)*local_20);
    uVar9 = pnVar7->label;
    pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
    pnVar6->max_count_label = uVar9;
  }
  pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
  if ((pnVar6->internal & 1U) != 0) {
    return true;
  }
  pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
  sVar5 = v_array<node_pred>::size(&pnVar6->preds);
  if (1 < sVar5) {
    if (*(ulong *)(local_10 + 0x28) <= *(ulong *)(local_10 + 0x30)) {
      pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
      uVar9 = pnVar6->min_count;
      pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
      uVar4 = pnVar6->max_count;
      iVar1 = *(int *)(local_10 + 0x3c);
      pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),0);
      if (uVar9 - uVar4 <= iVar1 * (pnVar6->min_count + 1)) goto LAB_002b189f;
    }
    if (*(ulong *)(local_10 + 0x30) < *(ulong *)(local_10 + 0x28)) {
      sVar5 = v_array<node>::size((v_array<node> *)(local_10 + 8));
      local_44 = (uint)sVar5;
      init_node();
      v_array<node>::push_back
                ((v_array<node> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 (node *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      sVar5 = v_array<node>::size((v_array<node> *)(local_10 + 8));
      local_48 = (uint)sVar5;
      init_node();
      v_array<node>::push_back
                ((v_array<node> *)CONCAT44(in_stack_fffffffffffffe74,in_stack_fffffffffffffe70),
                 (node *)CONCAT44(in_stack_fffffffffffffe6c,in_stack_fffffffffffffe68));
      lVar2 = *(long *)(local_10 + 0x30);
      *(long *)(local_10 + 0x30) = lVar2 + 1;
      pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
      pnVar6->base_predictor = (uint32_t)lVar2;
    }
    else {
      local_44 = find_switch_node((log_multi *)
                                  CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)local_44);
      local_48 = pnVar6->parent;
      pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)local_48);
      uVar3 = pnVar6->parent;
      pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)local_44);
      uVar9 = pnVar6->min_count;
      pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),0);
      if (uVar9 != pnVar6->min_count) {
        poVar8 = std::operator<<((ostream *)&std::cout,"glargh ");
        pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)local_44);
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,pnVar6->min_count);
        poVar8 = std::operator<<(poVar8," != ");
        pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),0);
        this = (void *)std::ostream::operator<<(poVar8,pnVar6->min_count);
        std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      }
      *(int *)(local_10 + 0x40) = *(int *)(local_10 + 0x40) + 1;
      pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)local_48);
      if (local_44 == pnVar6->right) {
        pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)local_48);
        local_108 = pnVar6->left;
      }
      else {
        pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)local_48);
        local_108 = pnVar6->right;
      }
      pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)uVar3);
      if (local_48 == pnVar6->left) {
        pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)uVar3);
        pnVar6->left = local_108;
      }
      else {
        pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)uVar3);
        pnVar6->right = local_108;
      }
      pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)local_108);
      pnVar6->parent = uVar3;
      update_min_count((log_multi *)CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80),
                       in_stack_fffffffffffffe7c);
      v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)local_44);
      init_leaf((node *)0x2b15ef);
      pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)local_48);
      uVar9 = pnVar6->base_predictor;
      pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
      pnVar6->base_predictor = uVar9;
      v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)local_48);
      init_leaf((node *)0x2b1664);
    }
    uVar3 = local_44;
    pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
    pnVar6->left = uVar3;
    uVar3 = *local_18;
    pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)local_44);
    pnVar6->parent = uVar3;
    uVar3 = local_48;
    pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
    pnVar6->right = uVar3;
    uVar3 = *local_18;
    pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)local_48);
    pnVar6->parent = uVar3;
    pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
    uVar3 = pnVar6->min_count >> 1;
    pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)local_44);
    pnVar6->min_count = uVar3;
    pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
    uVar9 = pnVar6->min_count;
    pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)local_44);
    uVar4 = uVar9 - pnVar6->min_count;
    pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)local_48);
    pnVar6->min_count = uVar4;
    update_min_count((log_multi *)CONCAT44(uVar4,uVar9),uVar3);
    pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
    uVar9 = pnVar6->max_count_label;
    pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)local_44);
    pnVar6->max_count_label = uVar9;
    pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
    uVar9 = pnVar6->max_count_label;
    pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)local_48);
    pnVar6->max_count_label = uVar9;
    pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
    pnVar6->internal = true;
  }
LAB_002b189f:
  pnVar6 = v_array<node>::operator[]((v_array<node> *)(local_10 + 8),(ulong)*local_18);
  return (bool)(pnVar6->internal & 1);
}

Assistant:

bool children(log_multi& b, uint32_t& current, uint32_t& class_index, uint32_t label)
{
  class_index = (uint32_t)b.nodes[current].preds.unique_add_sorted(node_pred(label));
  b.nodes[current].preds[class_index].label_count++;

  if (b.nodes[current].preds[class_index].label_count > b.nodes[current].max_count)
  {
    b.nodes[current].max_count = b.nodes[current].preds[class_index].label_count;
    b.nodes[current].max_count_label = b.nodes[current].preds[class_index].label;
  }

  if (b.nodes[current].internal)
    return true;
  else if (b.nodes[current].preds.size() > 1 &&
      (b.predictors_used < b.max_predictors ||
          b.nodes[current].min_count - b.nodes[current].max_count > b.swap_resist * (b.nodes[0].min_count + 1)))
  {
    // need children and we can make them.
    uint32_t left_child;
    uint32_t right_child;
    if (b.predictors_used < b.max_predictors)
    {
      left_child = (uint32_t)b.nodes.size();
      b.nodes.push_back(init_node());
      right_child = (uint32_t)b.nodes.size();
      b.nodes.push_back(init_node());
      b.nodes[current].base_predictor = (uint32_t)b.predictors_used++;
    }
    else
    {
      uint32_t swap_child = find_switch_node(b);
      uint32_t swap_parent = b.nodes[swap_child].parent;
      uint32_t swap_grandparent = b.nodes[swap_parent].parent;
      if (b.nodes[swap_child].min_count != b.nodes[0].min_count)
        cout << "glargh " << b.nodes[swap_child].min_count << " != " << b.nodes[0].min_count << endl;
      b.nbofswaps++;

      uint32_t nonswap_child;
      if (swap_child == b.nodes[swap_parent].right)
        nonswap_child = b.nodes[swap_parent].left;
      else
        nonswap_child = b.nodes[swap_parent].right;

      if (swap_parent == b.nodes[swap_grandparent].left)
        b.nodes[swap_grandparent].left = nonswap_child;
      else
        b.nodes[swap_grandparent].right = nonswap_child;
      b.nodes[nonswap_child].parent = swap_grandparent;
      update_min_count(b, nonswap_child);

      init_leaf(b.nodes[swap_child]);
      left_child = swap_child;
      b.nodes[current].base_predictor = b.nodes[swap_parent].base_predictor;
      init_leaf(b.nodes[swap_parent]);
      right_child = swap_parent;
    }
    b.nodes[current].left = left_child;
    b.nodes[left_child].parent = current;
    b.nodes[current].right = right_child;
    b.nodes[right_child].parent = current;

    b.nodes[left_child].min_count = b.nodes[current].min_count / 2;
    b.nodes[right_child].min_count = b.nodes[current].min_count - b.nodes[left_child].min_count;
    update_min_count(b, left_child);

    b.nodes[left_child].max_count_label = b.nodes[current].max_count_label;
    b.nodes[right_child].max_count_label = b.nodes[current].max_count_label;

    b.nodes[current].internal = true;
  }
  return b.nodes[current].internal;
}